

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O3

int enet_protocol_send_outgoing_commands(ENetHost *host,ENetEvent *event,int checkForTimeouts)

{
  size_t *psVar1;
  ENetList *pEVar2;
  _ENetListNode **pp_Var3;
  byte *pbVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint uVar9;
  uint32_t uVar10;
  ENetPeerState EVar11;
  _ENetListNode *p_Var12;
  _ENetHost *p_Var13;
  _ENetListNode *p_Var14;
  _ENetListNode *p_Var15;
  ushort uVar16;
  ushort uVar17;
  uint uVar18;
  ENetPeer *pEVar19;
  ENetChecksumCallback p_Var20;
  uint64_t uVar21;
  _ENetListNode *p_Var22;
  long lVar23;
  size_t sVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  ENetListIterator result;
  ENetPeer *peer;
  ulong uVar28;
  uint8_t headerData [12];
  undefined8 local_54;
  ENetBuffer *local_48;
  _ENetListNode *local_40;
  _ENetListNode *local_38;
  
  local_40 = &(host->dispatchQueue).sentinel;
  local_48 = host->buffers;
  pEVar19 = host->peers;
  sVar24 = host->peerCount;
  do {
    host->continueSending = 0;
    peer = pEVar19;
    if ((long)sVar24 < 1) {
      return 0;
    }
    do {
      if ((peer->state != ENET_PEER_STATE_DISCONNECTED) && (peer->state != ENET_PEER_STATE_ZOMBIE))
      {
        host->headerFlags = 0;
        host->commandCount = 0;
        host->bufferCount = 1;
        host->packetSize = (ulong)(host->checksumCallback != (ENetChecksumCallback)0x0) * 8 + 4;
        p_Var22 = (peer->acknowledgements).sentinel.next;
        if (p_Var22 != &(peer->acknowledgements).sentinel) {
          lVar23 = 0x6a8;
          uVar28 = 0x8c;
          do {
            if (0x68b < uVar28) {
              lVar23 = 0x8a8;
              uVar28 = 0x68c;
LAB_0010392d:
              host->continueSending = 1;
              break;
            }
            sVar24 = host->packetSize;
            if (peer->mtu - sVar24 < 8) goto LAB_0010392d;
            p_Var12 = p_Var22->next;
            *(ulong *)((long)&host->socket + lVar23) = (long)&host->socket + uVar28;
            *(undefined8 *)((long)&(host->address).field_0 + lVar23 + 4) = 8;
            host->packetSize = sVar24 + 8;
            uVar16 = *(ushort *)((long)&p_Var22[1].next + 6);
            uVar16 = uVar16 << 8 | uVar16 >> 8;
            *(undefined1 *)((long)&host->socket + uVar28) = 1;
            *(undefined1 *)((long)&host->socket + uVar28 + 1) =
                 *(undefined1 *)((long)&p_Var22[1].next + 5);
            *(ushort *)((long)&host->socket + uVar28 + 2) = uVar16;
            *(ushort *)((long)&(host->address).field_0 + uVar28) = uVar16;
            *(ushort *)((long)&(host->address).field_0 + uVar28 + 2) =
                 *(ushort *)&p_Var22[1].next << 8 | *(ushort *)&p_Var22[1].next >> 8;
            if (((ulong)p_Var22[1].next & 0xf00000000) == 0x400000000) {
              if (peer->state - ENET_PEER_STATE_CONNECTED < 2) {
                p_Var13 = peer->host;
                if (peer->incomingBandwidth != 0) {
                  psVar1 = &p_Var13->bandwidthLimitedPeers;
                  *psVar1 = *psVar1 - 1;
                }
                psVar1 = &p_Var13->connectedPeers;
                *psVar1 = *psVar1 - 1;
              }
              peer->state = ENET_PEER_STATE_ZOMBIE;
              if (peer->needsDispatch == 0) {
                p_Var14 = (host->dispatchQueue).sentinel.previous;
                (peer->dispatchList).previous = p_Var14;
                (peer->dispatchList).next = local_40;
                p_Var14->next = &peer->dispatchList;
                (host->dispatchQueue).sentinel.previous = &peer->dispatchList;
                peer->needsDispatch = 1;
              }
            }
            p_Var14 = p_Var22->next;
            p_Var22 = p_Var22->previous;
            p_Var22->next = p_Var14;
            p_Var14->previous = p_Var22;
            (*(code *)callbacks_1)();
            uVar28 = uVar28 + 0x30;
            lVar23 = lVar23 + 0x10;
            p_Var22 = p_Var12;
          } while (p_Var12 != &(peer->acknowledgements).sentinel);
          host->commandCount = (long)(short)(((short)((short)uVar28 + -0x8c) >> 4) * -0x5555);
          host->bufferCount = lVar23 + -0x698 >> 4;
        }
        if (checkForTimeouts != 0) {
          pEVar2 = &peer->sentReliableCommands;
          p_Var22 = (peer->sentReliableCommands).sentinel.next;
          if ((p_Var22 != &pEVar2->sentinel) &&
             (uVar7 = host->serviceTime, uVar7 - peer->nextTimeout < 86400000)) {
            p_Var12 = (peer->outgoingCommands).sentinel.next;
            do {
              p_Var14 = p_Var22->next;
              uVar8 = *(uint32_t *)((long)&p_Var22[1].next + 4);
              uVar27 = uVar7 - uVar8;
              uVar25 = uVar8 - uVar7;
              uVar18 = uVar27;
              if (86399999 < uVar27) {
                uVar18 = uVar25;
              }
              uVar9 = *(uint *)&p_Var22[1].previous;
              if (uVar9 <= uVar18) {
                uVar10 = peer->earliestTimeout;
                if ((uVar10 == 0) || (86399999 < uVar8 - uVar10)) {
                  peer->earliestTimeout = uVar8;
                  if (uVar8 != 0) goto LAB_00103a0a;
                }
                else {
                  uVar27 = uVar7 - uVar10;
                  uVar25 = uVar10 - uVar7;
LAB_00103a0a:
                  if (uVar27 < 86400000) {
                    uVar25 = uVar27;
                  }
                  if ((peer->timeoutMaximum <= uVar25) ||
                     ((*(uint *)((long)&p_Var22[1].previous + 4) <= uVar9 &&
                      (peer->timeoutMinimum <= uVar25)))) {
                    EVar11 = peer->state;
                    if (ENET_PEER_STATE_ACKNOWLEDGING_CONNECT < EVar11) {
                      host->recalculateBandwidthLimits = 1;
                    }
                    if (EVar11 == ENET_PEER_STATE_CONNECTING ||
                        ENET_PEER_STATE_CONNECTION_PENDING < EVar11) {
                      if (event == (ENetEvent *)0x0) {
                        peer->eventData = 0;
                        if (EVar11 - ENET_PEER_STATE_CONNECTED < 2) {
                          p_Var13 = peer->host;
                          if (peer->incomingBandwidth != 0) {
                            psVar1 = &p_Var13->bandwidthLimitedPeers;
                            *psVar1 = *psVar1 - 1;
                          }
                          psVar1 = &p_Var13->connectedPeers;
                          *psVar1 = *psVar1 - 1;
                        }
                        peer->state = ENET_PEER_STATE_ZOMBIE;
                        if (peer->needsDispatch == 0) {
                          p_Var22 = (host->dispatchQueue).sentinel.previous;
                          (peer->dispatchList).previous = p_Var22;
                          (peer->dispatchList).next = local_40;
                          p_Var22->next = &peer->dispatchList;
                          (host->dispatchQueue).sentinel.previous = &peer->dispatchList;
                          peer->needsDispatch = 1;
                        }
                        goto LAB_00103cda;
                      }
                      event->type = ENET_EVENT_TYPE_DISCONNECT_TIMEOUT;
                      event->peer = peer;
                      event->data = 0;
                      enet_peer_reset(peer);
                    }
                    else {
                      enet_peer_reset(peer);
                      if (event == (ENetEvent *)0x0) goto LAB_00103cda;
                    }
                    if (event->type != ENET_EVENT_TYPE_NONE) {
                      return 1;
                    }
                    goto LAB_00103cda;
                  }
                }
                if (p_Var22[5].previous != (_ENetListNode *)0x0) {
                  peer->reliableDataInTransit =
                       peer->reliableDataInTransit - (uint)*(ushort *)((long)&p_Var22[2].next + 4);
                }
                peer->totalPacketsLost = peer->totalPacketsLost + 1;
                iVar26 = peer->roundTripTimeVariance * 4 + peer->roundTripTime;
                *(int *)&p_Var22[1].previous = iVar26;
                *(uint32_t *)((long)&p_Var22[1].previous + 4) = iVar26 * peer->timeoutLimit;
                p_Var15 = p_Var22->previous;
                p_Var15->next = p_Var14;
                p_Var14->previous = p_Var15;
                p_Var15 = p_Var12->previous;
                p_Var22->previous = p_Var15;
                p_Var22->next = p_Var12;
                p_Var15->next = p_Var22;
                p_Var12->previous = p_Var22;
                p_Var22 = (peer->sentReliableCommands).sentinel.next;
                if (p_Var22 != &pEVar2->sentinel && p_Var14 == p_Var22) {
                  peer->nextTimeout =
                       *(int *)&p_Var14[1].previous + *(int *)((long)&p_Var14[1].next + 4);
                }
              }
              p_Var22 = p_Var14;
            } while (p_Var14 != &pEVar2->sentinel);
          }
        }
        if ((((peer->outgoingCommands).sentinel.next == &(peer->outgoingCommands).sentinel) ||
            (iVar26 = enet_protocol_check_outgoing_commands(host,peer), iVar26 != 0)) &&
           ((peer->sentReliableCommands).sentinel.next == &(peer->sentReliableCommands).sentinel)) {
          uVar25 = host->serviceTime - peer->lastReceiveTime;
          uVar18 = peer->lastReceiveTime - host->serviceTime;
          if (uVar25 < 86400000) {
            uVar18 = uVar25;
          }
          if ((peer->pingInterval <= uVar18) && (3 < (ulong)peer->mtu - host->packetSize)) {
            enet_peer_ping(peer);
            enet_protocol_check_outgoing_commands(host,peer);
          }
        }
        if (host->commandCount != 0) {
          host->buffers[0].data = &local_54;
          uVar18 = *(uint *)&host->headerFlags;
          sVar24 = 2;
          if ((uVar18 >> 0xe & 1) != 0) {
            uVar16 = (ushort)host->serviceTime;
            local_54._2_2_ = uVar16 << 8 | uVar16 >> 8;
            sVar24 = 4;
          }
          host->buffers[0].dataLength = sVar24;
          uVar16 = peer->outgoingPeerID;
          uVar17 = (ushort)uVar18;
          if (uVar16 < 0xfff) {
            iVar26._0_1_ = peer->outgoingSessionID;
            iVar26._1_1_ = peer->incomingSessionID;
            iVar26._2_2_ = *(undefined2 *)&peer->field_0x22;
            uVar17 = uVar17 | (ushort)(iVar26 << 0xc);
            uVar16 = uVar16 | uVar17;
            local_54._0_2_ = uVar16 << 8 | uVar16 >> 8;
            host->headerFlags = uVar17;
            p_Var20 = host->checksumCallback;
            if (p_Var20 != (ENetChecksumCallback)0x0) {
              uVar28 = (ulong)peer->connectID;
LAB_00103bc8:
              *(ulong *)((long)&local_54 + sVar24) = uVar28;
              host->buffers[0].dataLength = sVar24 + 8;
              uVar21 = (*p_Var20)(local_48,(int)host->bufferCount);
              *(uint64_t *)((long)&local_54 + sVar24) = uVar21;
            }
          }
          else {
            uVar17 = uVar17 | uVar16;
            local_54._0_2_ = uVar17 << 8 | uVar17 >> 8;
            p_Var20 = host->checksumCallback;
            if (p_Var20 != (ENetChecksumCallback)0x0) {
              uVar28 = 0;
              goto LAB_00103bc8;
            }
          }
          peer->lastSendTime = host->serviceTime;
          uVar18 = enet_socket_send(host->socket,&peer->address,local_48,host->bufferCount);
          pEVar2 = &peer->sentUnreliableCommands;
          p_Var22 = (peer->sentUnreliableCommands).sentinel.next;
          p_Var12 = &(peer->outgoingCommands).sentinel;
          if (p_Var22 != &pEVar2->sentinel) {
            do {
              local_38 = p_Var12;
              p_Var12 = p_Var22->next;
              p_Var14 = p_Var22->previous;
              p_Var14->next = p_Var12;
              p_Var12->previous = p_Var14;
              p_Var12 = p_Var22[5].previous;
              if (p_Var12 != (_ENetListNode *)0x0) {
                pp_Var3 = &p_Var12[1].previous;
                *(int *)pp_Var3 = *(int *)pp_Var3 + -1;
                if (*(int *)pp_Var3 == 0) {
                  pbVar4 = (byte *)((long)&p_Var12->next + 1);
                  *pbVar4 = *pbVar4 | 1;
                  if (p_Var12[1].next != (_ENetListNode *)0x0) {
                    (*(code *)p_Var12[1].next)(p_Var12);
                  }
                  (*(code *)callbacks_1)(p_Var12);
                }
              }
              (*(code *)callbacks_1)(p_Var22);
              p_Var22 = (pEVar2->sentinel).next;
              p_Var12 = local_38;
            } while (p_Var22 != &pEVar2->sentinel);
            if (((peer->state == ENET_PEER_STATE_DISCONNECT_LATER) &&
                (((ENetListNode *)&local_38->next)->next == local_38)) &&
               ((peer->sentReliableCommands).sentinel.next == &(peer->sentReliableCommands).sentinel
               )) {
              enet_peer_disconnect(peer,peer->eventData);
            }
          }
          if ((int)uVar18 < 0) {
            return -1;
          }
          peer->totalDataSent = peer->totalDataSent + (ulong)uVar18;
          uVar5 = host->totalSentData;
          uVar6 = host->totalSentPackets;
          host->totalSentData = uVar5 + uVar18;
          host->totalSentPackets = uVar6 + 1;
        }
      }
LAB_00103cda:
      peer = peer + 1;
      pEVar19 = host->peers;
      sVar24 = host->peerCount;
    } while (peer < pEVar19 + sVar24);
    if (host->continueSending == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

static int enet_protocol_send_outgoing_commands(ENetHost* host, ENetEvent* event, int checkForTimeouts) {
	uint8_t headerData[sizeof(ENetProtocolHeader) + sizeof(enet_checksum)];
	ENetProtocolHeader* header = (ENetProtocolHeader*)headerData;
	ENetPeer* currentPeer;
	int sentLength;
	host->continueSending = 1;

	while (host->continueSending) {
		for (host->continueSending = 0, currentPeer = host->peers; currentPeer < &host->peers[host->peerCount]; ++currentPeer) {
			if (currentPeer->state == ENET_PEER_STATE_DISCONNECTED || currentPeer->state == ENET_PEER_STATE_ZOMBIE)
				continue;

			host->headerFlags = 0;
			host->commandCount = 0;
			host->bufferCount = 1;
			host->packetSize = sizeof(ENetProtocolHeader);
			
			if (host->checksumCallback != NULL)
					host->packetSize += sizeof(enet_checksum);
				
			if (!enet_list_empty(&currentPeer->acknowledgements))
				enet_protocol_send_acknowledgements(host, currentPeer);

			if (checkForTimeouts != 0 && !enet_list_empty(&currentPeer->sentReliableCommands) && ENET_TIME_GREATER_EQUAL(host->serviceTime, currentPeer->nextTimeout) && enet_protocol_check_timeouts(host, currentPeer, event) == 1) {
				if (event != NULL && event->type != ENET_EVENT_TYPE_NONE)
					return 1;
				else
					continue;
			}

			if ((enet_list_empty(&currentPeer->outgoingCommands) || enet_protocol_check_outgoing_commands(host, currentPeer)) && enet_list_empty(&currentPeer->sentReliableCommands) && ENET_TIME_DIFFERENCE(host->serviceTime, currentPeer->lastReceiveTime) >= currentPeer->pingInterval && currentPeer->mtu - host->packetSize >= sizeof(ENetProtocolPing)) {
				enet_peer_ping(currentPeer);
				enet_protocol_check_outgoing_commands(host, currentPeer);
			}

			if (host->commandCount == 0)
				continue;

			host->buffers->data = headerData;

			if (host->headerFlags & ENET_PROTOCOL_HEADER_FLAG_SENT_TIME) {
				header->sentTime = ENET_HOST_TO_NET_16(host->serviceTime & 0xFFFF);
				host->buffers->dataLength = sizeof(ENetProtocolHeader);
			}
			else {
				host->buffers->dataLength = (size_t) & ((ENetProtocolHeader*)0)->sentTime;
			}

			if (currentPeer->outgoingPeerID < ENET_PROTOCOL_MAXIMUM_PEER_ID)
				host->headerFlags |= currentPeer->outgoingSessionID << ENET_PROTOCOL_HEADER_SESSION_SHIFT;

			header->peerID = ENET_HOST_TO_NET_16(currentPeer->outgoingPeerID | host->headerFlags);

			if (host->checksumCallback != NULL) {
				enet_checksum* checksum = (enet_checksum*)&headerData[host->buffers->dataLength];
				*checksum = currentPeer->outgoingPeerID < ENET_PROTOCOL_MAXIMUM_PEER_ID ? currentPeer->connectID : 0;
				host->buffers->dataLength += sizeof(enet_checksum);
				*checksum = host->checksumCallback(host->buffers, host->bufferCount);
			}

			currentPeer->lastSendTime = host->serviceTime;
			sentLength = enet_socket_send(host->socket, &currentPeer->address, host->buffers, host->bufferCount);

			enet_protocol_remove_sent_unreliable_commands(currentPeer);

			if (sentLength < 0)
				return -1;

			host->totalSentData += sentLength;
			currentPeer->totalDataSent += sentLength;
			host->totalSentPackets++;
		}
	}

	return 0;
}